

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void __thiscall pbrt::IPCChannel::Connect(IPCChannel *this)

{
  int iVar1;
  char **args;
  char *__service;
  int *piVar2;
  char *in_RDI;
  int err_1;
  addrinfo *ptr;
  int err;
  addrinfo *addrinfo;
  addrinfo hints;
  int vb;
  socket_t va;
  undefined8 in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char (*in_stack_ffffffffffffff48) [5];
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  LogLevel in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  LogLevel in_stack_ffffffffffffff74;
  uint uVar3;
  string local_88 [8];
  char (*in_stack_ffffffffffffff80) [9];
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int *in_stack_ffffffffffffff98;
  addrinfo *file;
  undefined8 in_stack_ffffffffffffffa0;
  LogLevel level;
  addrinfo *local_50;
  addrinfo local_48;
  undefined4 local_18;
  int local_14;
  
  local_14 = *(int *)(in_RDI + 0x48);
  local_18 = 0xffffffff;
  if (local_14 != -1) {
    LogFatal<char_const(&)[9],char_const(&)[5],char_const(&)[9],int&,char_const(&)[5],int&>
              (in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
               in_stack_ffffffffffffff58,
               (char (*) [9])CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
               (char (*) [5])CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff98);
  }
  if (LOGGING_LogLevel < 1) {
    Log((LogLevel)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(char *)in_stack_ffffffffffffff98,
        in_stack_ffffffffffffff94,(char *)in_stack_ffffffffffffff88);
  }
  memset(&local_48,0,0x30);
  local_48.ai_family = 0;
  local_48.ai_socktype = 1;
  args = (char **)std::__cxx11::string::c_str();
  __service = (char *)std::__cxx11::string::c_str();
  iVar1 = getaddrinfo((char *)args,__service,&local_48,&local_50);
  if (iVar1 != 0) {
    gai_strerror(iVar1);
    ErrorExit<char_const*>(in_RDI,args);
  }
  in_RDI[0x48] = -1;
  in_RDI[0x49] = -1;
  in_RDI[0x4a] = -1;
  in_RDI[0x4b] = -1;
  for (file = local_50; level = (LogLevel)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
      file != (addrinfo *)0x0; file = file->ai_next) {
    iVar1 = socket(file->ai_family,file->ai_socktype,file->ai_protocol);
    *(int *)(in_RDI + 0x48) = iVar1;
    if (*(int *)(in_RDI + 0x48) == -1) {
      uVar3 = 0;
      if (LOGGING_LogLevel < 1) {
        LastError();
        ErrorString_abi_cxx11_((int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        uVar3 = 0x1000000;
        Log<std::__cxx11::string>
                  (in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                   *in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      }
      if ((uVar3 & 0x1000000) != 0) {
        std::__cxx11::string::~string(local_88);
      }
    }
    else {
      iVar1 = connect(*(int *)(in_RDI + 0x48),file->ai_addr,file->ai_addrlen);
      level = (LogLevel)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
      if (*piVar2 == 0x6f) {
        if (LOGGING_LogLevel < 1) {
          Log((LogLevel)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(char *)file,
              in_stack_ffffffffffffff94,(char *)in_stack_ffffffffffffff88);
        }
      }
      else if (LOGGING_LogLevel < 1) {
        ErrorString_abi_cxx11_((int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        Log<std::__cxx11::string>
                  (in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                   *in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      }
      closeSocket(0);
      in_RDI[0x48] = -1;
      in_RDI[0x49] = -1;
      in_RDI[0x4a] = -1;
      in_RDI[0x4b] = -1;
    }
  }
  freeaddrinfo(local_50);
  if ((*(int *)(in_RDI + 0x48) != -1) && (LOGGING_LogLevel < 1)) {
    Log(level,(char *)file,in_stack_ffffffffffffff94,(char *)in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void IPCChannel::Connect() {
    CHECK_EQ(socketFd, INVALID_SOCKET);

    LOG_VERBOSE("Trying to connect to display server");

    struct addrinfo hints = {}, *addrinfo;
    hints.ai_family = PF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;
    int err = getaddrinfo(address.c_str(), port.c_str(), &hints, &addrinfo);
    if (err)
        ErrorExit("%s", gai_strerror(err));

    socketFd = INVALID_SOCKET;
    for (struct addrinfo *ptr = addrinfo; ptr; ptr = ptr->ai_next) {
        socketFd = socket(ptr->ai_family, ptr->ai_socktype, ptr->ai_protocol);
        if (socketFd == INVALID_SOCKET) {
            LOG_VERBOSE("socket() failed: %s", ErrorString());
            continue;
        }

        if (connect(socketFd, ptr->ai_addr, ptr->ai_addrlen) == SOCKET_ERROR) {
#ifdef PBRT_IS_WINDOWS
            int err = WSAGetLastError();
#else
            int err = errno;
#endif
            if (err == SocketError::ConnRefused)
                LOG_VERBOSE("Connection refused. Will try again...");
            else
                LOG_VERBOSE("connect() failed: %s", ErrorString(err));

            closeSocket(socketFd);
            socketFd = INVALID_SOCKET;
            continue;
        }

        break;  // success
    }

    freeaddrinfo(addrinfo);
    if (socketFd != INVALID_SOCKET)
        LOG_VERBOSE("Connected to display server");
}